

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void xmlParsePEReference(xmlParserCtxtPtr ctxt)

{
  getParameterEntitySAXFunc p_Var1;
  int iVar2;
  xmlChar *pxVar3;
  xmlEntityPtr ent;
  xmlParserInputPtr pxVar4;
  
  if (*ctxt->input->cur != '%') {
    return;
  }
  xmlNextChar(ctxt);
  pxVar3 = xmlParseName(ctxt);
  if (pxVar3 == (xmlChar *)0x0) {
    xmlFatalErrMsg(ctxt,XML_ERR_PEREF_NO_NAME,"PEReference: no name\n");
    return;
  }
  if (*ctxt->input->cur != ';') {
    xmlFatalErr(ctxt,XML_ERR_PEREF_SEMICOL_MISSING,(char *)0x0);
    return;
  }
  xmlNextChar(ctxt);
  ctxt->hasPErefs = 1;
  if (((ctxt->sax == (_xmlSAXHandler *)0x0) ||
      (p_Var1 = ctxt->sax->getParameterEntity, p_Var1 == (getParameterEntitySAXFunc)0x0)) ||
     (ent = (*p_Var1)(ctxt->userData,pxVar3), ent == (xmlEntityPtr)0x0)) {
    xmlHandleUndeclaredEntity(ctxt,pxVar3);
    return;
  }
  if ((ent->etype & ~XML_INTERNAL_GENERAL_ENTITY) != XML_INTERNAL_PARAMETER_ENTITY) {
    xmlWarningMsg(ctxt,XML_WAR_UNDECLARED_ENTITY,"Internal: %%%s; is not a parameter entity\n",
                  pxVar3,(xmlChar *)0x0);
    return;
  }
  if (ent->etype == XML_EXTERNAL_PARAMETER_ENTITY) {
    if ((ctxt->options & 0x800000) != 0) {
      return;
    }
    if (((ctxt->loadsubset == 0) && (ctxt->replaceEntities == 0)) && (ctxt->validate == 0)) {
      return;
    }
  }
  if ((ent->flags & 8) != 0) {
    xmlFatalErr(ctxt,XML_ERR_ENTITY_LOOP,(char *)0x0);
    xmlHaltParser(ctxt);
    return;
  }
  pxVar4 = xmlNewEntityInputStream(ctxt,ent);
  iVar2 = xmlCtxtPushInput(ctxt,pxVar4);
  if (-1 < iVar2) {
    *(byte *)&ent->flags = (byte)ent->flags | 8;
    pxVar4 = ctxt->input;
    if (((pxVar4->flags & 0x40) == 0) && ((long)pxVar4->end - (long)pxVar4->cur < 0xfa)) {
      xmlParserGrow(ctxt);
    }
    if (ent->etype != XML_EXTERNAL_PARAMETER_ENTITY) {
      return;
    }
    xmlDetectEncoding(ctxt);
    pxVar3 = ctxt->input->cur;
    if (*pxVar3 != '<') {
      return;
    }
    if (pxVar3[1] != '?') {
      return;
    }
    if (pxVar3[2] != 'x') {
      return;
    }
    if (pxVar3[3] != 'm') {
      return;
    }
    if (pxVar3[4] != 'l') {
      return;
    }
    if (0x20 < (ulong)pxVar3[5]) {
      return;
    }
    if ((0x100002600U >> ((ulong)pxVar3[5] & 0x3f) & 1) == 0) {
      return;
    }
    xmlParseTextDecl(ctxt);
    return;
  }
  xmlFreeInputStream(pxVar4);
  return;
}

Assistant:

void
xmlParsePEReference(xmlParserCtxtPtr ctxt)
{
    const xmlChar *name;
    xmlEntityPtr entity = NULL;
    xmlParserInputPtr input;

    if (RAW != '%')
        return;
    NEXT;
    name = xmlParseName(ctxt);
    if (name == NULL) {
	xmlFatalErrMsg(ctxt, XML_ERR_PEREF_NO_NAME, "PEReference: no name\n");
	return;
    }
    if (RAW != ';') {
	xmlFatalErr(ctxt, XML_ERR_PEREF_SEMICOL_MISSING, NULL);
        return;
    }

    NEXT;

    /* Must be set before xmlHandleUndeclaredEntity */
    ctxt->hasPErefs = 1;

    /*
     * Request the entity from SAX
     */
    if ((ctxt->sax != NULL) &&
	(ctxt->sax->getParameterEntity != NULL))
	entity = ctxt->sax->getParameterEntity(ctxt->userData, name);

    if (entity == NULL) {
        xmlHandleUndeclaredEntity(ctxt, name);
    } else {
	/*
	 * Internal checking in case the entity quest barfed
	 */
	if ((entity->etype != XML_INTERNAL_PARAMETER_ENTITY) &&
	    (entity->etype != XML_EXTERNAL_PARAMETER_ENTITY)) {
	    xmlWarningMsg(ctxt, XML_WAR_UNDECLARED_ENTITY,
		  "Internal: %%%s; is not a parameter entity\n",
			  name, NULL);
	} else {
	    if ((entity->etype == XML_EXTERNAL_PARAMETER_ENTITY) &&
                ((ctxt->options & XML_PARSE_NO_XXE) ||
		 ((ctxt->loadsubset == 0) &&
		  (ctxt->replaceEntities == 0) &&
		  (ctxt->validate == 0))))
		return;

            if (entity->flags & XML_ENT_EXPANDING) {
                xmlFatalErr(ctxt, XML_ERR_ENTITY_LOOP, NULL);
                xmlHaltParser(ctxt);
                return;
            }

	    input = xmlNewEntityInputStream(ctxt, entity);
	    if (xmlCtxtPushInput(ctxt, input) < 0) {
                xmlFreeInputStream(input);
		return;
            }

            entity->flags |= XML_ENT_EXPANDING;

            GROW;

	    if (entity->etype == XML_EXTERNAL_PARAMETER_ENTITY) {
                xmlDetectEncoding(ctxt);

                if ((CMP5(CUR_PTR, '<', '?', 'x', 'm', 'l')) &&
                    (IS_BLANK_CH(NXT(5)))) {
                    xmlParseTextDecl(ctxt);
                }
            }
	}
    }
}